

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

int __thiscall
ICM::DefFunc::Calc::Inc::sign
          (Inc *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  DefaultType local_64;
  TypeObject local_60;
  DefaultType local_44;
  TypeObject local_40;
  InitList local_28;
  EVP_PKEY_CTX *local_18;
  Inc *this_local;
  
  local_44 = T_Number;
  local_18 = ctx;
  this_local = this;
  TypeObject::TypeObject(&local_40,&local_44);
  local_28._M_array = &local_40;
  local_28._M_len = 1;
  local_64 = T_Number;
  TypeObject::TypeObject(&local_60,&local_64);
  Function::Signature::Signature((Signature *)this,&local_28,&local_60,false);
  return (int)this;
}

Assistant:

S sign() const {
					return S({ T_Number }, T_Number); // N -> N
				}